

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
::emplace_new_key<slang::BufferID>
          (sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
           *this,int8_t distance_from_desired,EntryPointer current_entry,BufferID *key)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
  pVar6;
  pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
  pVar7;
  bool local_61;
  templated_iterator<slang::BufferID> local_60;
  iterator result;
  value_type to_insert;
  BufferID *key_local;
  EntryPointer current_entry_local;
  sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
  *psStack_20;
  int8_t distance_from_desired_local;
  sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
  *this_local;
  bool local_10;
  
  current_entry_local._7_1_ = distance_from_desired;
  psStack_20 = this;
  if ((this->num_slots_minus_one != 0) && (distance_from_desired != this->max_lookups)) {
    lVar3 = this->num_elements + 1;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    lVar2 = this->num_slots_minus_one + 1;
    auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5._0_8_ = lVar2;
    auVar5._12_4_ = 0x45300000;
    if ((auVar4._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) <=
        ((auVar5._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
        (double)this->_max_load_factor) {
      bVar1 = sherwood_v3_entry<slang::BufferID>::is_empty(current_entry);
      if (bVar1) {
        sherwood_v3_entry<slang::BufferID>::emplace<slang::BufferID>
                  (current_entry,current_entry_local._7_1_,key);
        this->num_elements = this->num_elements + 1;
        templated_iterator<slang::BufferID>::templated_iterator
                  ((templated_iterator<slang::BufferID> *)&to_insert,current_entry);
        result.current._7_1_ = 1;
        std::
        pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
        ::pair<bool,_true>((pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
                            *)&this_local,(templated_iterator<slang::BufferID> *)&to_insert,
                           (bool *)((long)&result.current + 7));
        pVar6._8_8_ = extraout_RDX;
        pVar6.first.current = (EntryPointer)this_local;
      }
      else {
        result.current._0_4_ = key->id;
        std::swap<signed_char>
                  ((char *)((long)&current_entry_local + 7),&current_entry->distance_from_desired);
        std::swap<slang::BufferID>((BufferID *)&result,&(current_entry->field_1).value);
        templated_iterator<slang::BufferID>::templated_iterator(&local_60,current_entry);
        current_entry_local._7_1_ = current_entry_local._7_1_ + '\x01';
        key_local = (BufferID *)(current_entry + 1);
        while (bVar1 = sherwood_v3_entry<slang::BufferID>::is_empty
                                 ((sherwood_v3_entry<slang::BufferID> *)key_local), !bVar1) {
          if ((char)key_local->id < current_entry_local._7_1_) {
            std::swap<signed_char>((char *)((long)&current_entry_local + 7),(char *)key_local);
            std::swap<slang::BufferID>((BufferID *)&result,key_local + 1);
            current_entry_local._7_1_ = current_entry_local._7_1_ + '\x01';
          }
          else {
            current_entry_local._7_1_ = current_entry_local._7_1_ + '\x01';
            if (current_entry_local._7_1_ == this->max_lookups) {
              std::swap<slang::BufferID>((BufferID *)&result,&((local_60.current)->field_1).value);
              grow(this);
              pVar6 = emplace<slang::BufferID>(this,(BufferID *)&result);
              local_10 = pVar6.second;
              goto LAB_001a5935;
            }
          }
          key_local = key_local + 2;
        }
        sherwood_v3_entry<slang::BufferID>::emplace<slang::BufferID>
                  ((sherwood_v3_entry<slang::BufferID> *)key_local,current_entry_local._7_1_,
                   (BufferID *)&result);
        this->num_elements = this->num_elements + 1;
        local_61 = true;
        std::
        pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
        ::
        pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>_&,_bool,_true>
                  ((pair<ska::detailv3::sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>::templated_iterator<slang::BufferID>,_bool>
                    *)&this_local,&local_60,&local_61);
        pVar6._8_8_ = extraout_RDX_00;
        pVar6.first.current = (EntryPointer)this_local;
      }
      goto LAB_001a5935;
    }
  }
  grow(this);
  pVar6 = emplace<slang::BufferID>(this,key);
  local_10 = pVar6.second;
LAB_001a5935:
  this_local = (sherwood_v3_table<slang::BufferID,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::BufferID>_>,_std::allocator<slang::BufferID>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::BufferID>_>_>
                *)pVar6.first.current;
  pVar7._9_7_ = pVar6._9_7_;
  pVar7.second = local_10;
  pVar7.first.current = (EntryPointer)this_local;
  return pVar7;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }